

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HandlerManager.cpp
# Opt level: O3

void __thiscall
HandlerManager::registerCapabilities(HandlerManager *this,ServerCapabilities *capabilities)

{
  pointer ppRVar1;
  pointer ppNVar2;
  vector<RequestHandler_*,_std::allocator<RequestHandler_*>_> *__range1;
  pointer ppRVar3;
  pointer ppNVar4;
  
  ppRVar1 = (this->requestHandlers).
            super__Vector_base<RequestHandler_*,_std::allocator<RequestHandler_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppRVar3 = (this->requestHandlers).
                 super__Vector_base<RequestHandler_*,_std::allocator<RequestHandler_*>_>._M_impl.
                 super__Vector_impl_data._M_start; ppRVar3 != ppRVar1; ppRVar3 = ppRVar3 + 1) {
    (**((*ppRVar3)->super_Handler)._vptr_Handler)(*ppRVar3,capabilities);
  }
  ppNVar2 = (this->notificationHandlers).
            super__Vector_base<NotificationHandler_*,_std::allocator<NotificationHandler_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  for (ppNVar4 = (this->notificationHandlers).
                 super__Vector_base<NotificationHandler_*,_std::allocator<NotificationHandler_*>_>.
                 _M_impl.super__Vector_impl_data._M_start; ppNVar4 != ppNVar2; ppNVar4 = ppNVar4 + 1
      ) {
    (**((*ppNVar4)->super_Handler)._vptr_Handler)(*ppNVar4,capabilities);
  }
  return;
}

Assistant:

void HandlerManager::registerCapabilities (Init::ServerCapabilities &capabilities) {
    for (RequestHandler *handler : requestHandlers) {
        handler->registerCapabilities(capabilities);
    }

    for (NotificationHandler *handler : notificationHandlers) {
        handler->registerCapabilities(capabilities);
    }
}